

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::acceptorT11FixturenextResendRequestT1142RepeatingGroupHelper::
~acceptorT11FixturenextResendRequestT1142RepeatingGroupHelper
          (acceptorT11FixturenextResendRequestT1142RepeatingGroupHelper *this)

{
  ~acceptorT11FixturenextResendRequestT1142RepeatingGroupHelper
            ((acceptorT11FixturenextResendRequestT1142RepeatingGroupHelper *)&this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(acceptorT11Fixture, nextResendRequestT1142RepeatingGroup)
{
  object->next( createT11Logon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  FIX::Message message = createT1142ExecutionReport( "ISLD", "TW", 2 );
  CHECK( object->send( message ) );
  object->next( createT11ResendRequest( "ISLD", "TW", 3, 2, 2 ), UtcTimeStamp() );

  PossDupFlag possDupFlag;
  OrigSendingTime origSendingTime;
  SendingTime sendingTime;
  lastResent.getHeader().getField( possDupFlag );
  lastResent.getHeader().getField( origSendingTime );
  lastResent.getHeader().getField( sendingTime );
  message.getHeader().setField( possDupFlag );
  message.getHeader().setField( origSendingTime );
  message.getHeader().setField( sendingTime );
  CHECK_EQUAL( message.toString(), lastResent.toString() );
}